

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O2

VkBool32 VulkanUtilities::anon_unknown_0::DebugMessengerCallback
                   (VkDebugUtilsMessageSeverityFlagBitsEXT messageSeverity,
                   VkDebugUtilsMessageTypeFlagsEXT messageType,
                   VkDebugUtilsMessengerCallbackDataEXT *callbackData,void *userData)

{
  int *piVar1;
  int iVar2;
  VkDebugUtilsObjectNameInfoEXT *pVVar3;
  VkDebugUtilsLabelEXT *pVVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  iterator iVar8;
  ostream *poVar9;
  char *pcVar10;
  uint uVar11;
  char **Args;
  uint32_t obj;
  ulong uVar12;
  char *pcVar13;
  char (*in_R8) [53];
  uint32_t l;
  long lVar14;
  undefined8 local_200 [4];
  undefined8 local_1e0;
  string _msg_1;
  stringstream debugMessage;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined8 uStack_198;
  uint auStack_190 [88];
  
  uVar11 = 2;
  if ((messageSeverity & VK_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT) == 0) {
    uVar11 = messageSeverity >> 8 & 1;
  }
  if (callbackData->pMessageIdName != (Char *)0x0) {
    Diligent::HashMapStringKey::HashMapStringKey
              ((HashMapStringKey *)&debugMessage,callbackData->pMessageIdName,false);
    iVar8 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(anonymous_namespace)::g_IgnoreMessages,(HashMapStringKey *)&debugMessage);
    Diligent::HashMapStringKey::Clear((HashMapStringKey *)&debugMessage);
    if (iVar8.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      LOCK();
      piVar1 = (int *)((long)iVar8.
                             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_false>
                             ._M_cur + 0x18);
      iVar2 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      if (iVar2 != 0 || (messageSeverity >> 0xc & 1) == 0) {
        return 0;
      }
      Diligent::FormatString<char[26],char_const*,char[53]>
                ((string *)&debugMessage,(Diligent *)"Vulkan Validation error \'",
                 (char (*) [26])&callbackData->pMessageIdName,
                 (char **)"\' is being ignored. This may obfuscate a real issue.",in_R8);
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        (*(code *)Diligent::DebugMessageCallback)(1,_debugMessage,0,0,0);
      }
      std::__cxx11::string::~string((string *)&debugMessage);
      return 0;
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&debugMessage);
  std::operator<<((ostream *)local_1a8._M_local_buf,"Vulkan debug message (");
  if (((messageType & 1) != 0) &&
     (std::operator<<((ostream *)local_1a8._M_local_buf,"general"), (messageType & 6) != 0)) {
    std::operator<<((ostream *)local_1a8._M_local_buf,", ");
  }
  if ((messageType & 2) == 0) {
    if ((messageType & 4) == 0) goto LAB_002624d0;
  }
  else {
    std::operator<<((ostream *)local_1a8._M_local_buf,"validation");
    if ((messageType & 4) == 0) goto LAB_002624d0;
    std::operator<<((ostream *)local_1a8._M_local_buf,", ");
  }
  std::operator<<((ostream *)local_1a8._M_local_buf,"performance");
LAB_002624d0:
  std::operator<<((ostream *)local_1a8._M_local_buf,"): ");
  pcVar10 = callbackData->pMessageIdName;
  pcVar13 = "<Unknown name>";
  if (pcVar10 != (char *)0x0) {
    pcVar13 = pcVar10;
  }
  std::operator<<((ostream *)local_1a8._M_local_buf,pcVar13);
  if (callbackData->pMessage != (char *)0x0) {
    poVar9 = std::endl<char,std::char_traits<char>>((ostream *)local_1a8._M_local_buf);
    poVar9 = std::operator<<(poVar9,"                 ");
    std::operator<<(poVar9,callbackData->pMessage);
  }
  uVar7 = callbackData->objectCount;
  if (uVar7 != 0) {
    lVar14 = 0x20;
    for (uVar12 = 0; uVar12 < uVar7; uVar12 = uVar12 + 1) {
      pVVar3 = callbackData->pObjects;
      poVar9 = std::endl<char,std::char_traits<char>>((ostream *)local_1a8._M_local_buf);
      poVar9 = std::operator<<(poVar9,"                 Object[");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9,"] (");
      pcVar10 = VkObjectTypeToString(*(VkObjectType *)((long)pVVar3 + lVar14 + -0x10));
      poVar9 = std::operator<<(poVar9,pcVar10);
      poVar9 = std::operator<<(poVar9,"): Handle ");
      *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
           *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar9 = std::operator<<(poVar9,"0x");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      if (*(long *)((long)&pVVar3->sType + lVar14) != 0) {
        poVar9 = std::operator<<((ostream *)local_1a8._M_local_buf,", Name: \'");
        poVar9 = std::operator<<(poVar9,*(char **)((long)&pVVar3->sType + lVar14));
        std::operator<<(poVar9,'\'');
      }
      uVar7 = callbackData->objectCount;
      lVar14 = lVar14 + 0x28;
    }
  }
  uVar7 = callbackData->cmdBufLabelCount;
  if (uVar7 != 0) {
    lVar14 = 0x10;
    for (uVar12 = 0; uVar12 < uVar7; uVar12 = uVar12 + 1) {
      pVVar4 = callbackData->pCmdBufLabels;
      poVar9 = std::endl<char,std::char_traits<char>>((ostream *)local_1a8._M_local_buf);
      poVar9 = std::operator<<(poVar9,"                 Label[");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::operator<<(poVar9,"]");
      if (*(long *)((long)pVVar4->color + lVar14 + -0x18) != 0) {
        poVar9 = std::operator<<((ostream *)local_1a8._M_local_buf," - ");
        std::operator<<(poVar9,*(char **)((long)pVVar4->color + lVar14 + -0x18));
      }
      std::operator<<((ostream *)local_1a8._M_local_buf," {");
      *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) &
           0xfffffefb | 4;
      *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) = 4;
      poVar9 = (ostream *)
               std::ostream::operator<<(&local_1a8,*(float *)((long)pVVar4->color + lVar14 + -0x10))
      ;
      poVar9 = std::operator<<(poVar9,", ");
      lVar5 = *(long *)poVar9;
      lVar6 = *(long *)(lVar5 + -0x18);
      *(uint *)(poVar9 + lVar6 + 0x18) = *(uint *)(poVar9 + lVar6 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar9 + *(long *)(lVar5 + -0x18) + 0x10) = 4;
      poVar9 = (ostream *)
               std::ostream::operator<<(poVar9,*(float *)((long)pVVar4->color + lVar14 + -0xc));
      poVar9 = std::operator<<(poVar9,", ");
      lVar5 = *(long *)poVar9;
      lVar6 = *(long *)(lVar5 + -0x18);
      *(uint *)(poVar9 + lVar6 + 0x18) = *(uint *)(poVar9 + lVar6 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar9 + *(long *)(lVar5 + -0x18) + 0x10) = 4;
      poVar9 = (ostream *)
               std::ostream::operator<<(poVar9,*(float *)((long)pVVar4->color + lVar14 + -8));
      poVar9 = std::operator<<(poVar9,", ");
      lVar5 = *(long *)poVar9;
      lVar6 = *(long *)(lVar5 + -0x18);
      *(uint *)(poVar9 + lVar6 + 0x18) = *(uint *)(poVar9 + lVar6 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar9 + *(long *)(lVar5 + -0x18) + 0x10) = 4;
      poVar9 = (ostream *)
               std::ostream::operator<<(poVar9,*(float *)((long)pVVar4->color + lVar14 + -4));
      std::operator<<(poVar9,"}");
      uVar7 = callbackData->cmdBufLabelCount;
      lVar14 = lVar14 + 0x28;
    }
  }
  std::__cxx11::stringbuf::str();
  local_1e0 = local_200[0];
  Diligent::FormatString<char_const*>(&_msg_1,(Diligent *)&local_1e0,Args);
  std::__cxx11::string::~string((string *)local_200);
  if (Diligent::DebugMessageCallback != (undefined *)0x0) {
    (*(code *)Diligent::DebugMessageCallback)(uVar11,_msg_1._M_dataplus._M_p,0,0,0);
  }
  std::__cxx11::string::~string((string *)&_msg_1);
  std::__cxx11::stringstream::~stringstream((stringstream *)&debugMessage);
  return 0;
}

Assistant:

VKAPI_ATTR VkBool32 VKAPI_CALL DebugMessengerCallback(VkDebugUtilsMessageSeverityFlagBitsEXT      messageSeverity,
                                                      VkDebugUtilsMessageTypeFlagsEXT             messageType,
                                                      const VkDebugUtilsMessengerCallbackDataEXT* callbackData,
                                                      void*                                       userData)
{
    auto MsgSeverity = DEBUG_MESSAGE_SEVERITY_INFO;
    if (messageSeverity & VK_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT)
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_ERROR;
    }
    else if (messageSeverity & VK_DEBUG_UTILS_MESSAGE_SEVERITY_WARNING_BIT_EXT)
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_WARNING;
    }
    else if (messageSeverity & (VK_DEBUG_UTILS_MESSAGE_SEVERITY_INFO_BIT_EXT | VK_DEBUG_UTILS_MESSAGE_SEVERITY_VERBOSE_BIT_EXT))
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_INFO;
    }
    else
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_INFO;
    }

    if (callbackData->pMessageIdName != nullptr)
    {
        auto it = g_IgnoreMessages.find(callbackData->pMessageIdName);
        if (it != g_IgnoreMessages.end())
        {
            const auto PrevMsgCount = it->second.fetch_add(1);
            if (MsgSeverity == DEBUG_MESSAGE_SEVERITY_ERROR && PrevMsgCount == 0)
            {
                LOG_WARNING_MESSAGE("Vulkan Validation error '", callbackData->pMessageIdName, "' is being ignored. This may obfuscate a real issue.");
            }
            return VK_FALSE;
        }
    }

    std::stringstream debugMessage;
    debugMessage << "Vulkan debug message (";
    if (messageType & VK_DEBUG_UTILS_MESSAGE_TYPE_GENERAL_BIT_EXT)
    {
        debugMessage << "general";
        if (messageType & (VK_DEBUG_UTILS_MESSAGE_TYPE_VALIDATION_BIT_EXT | VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT))
            debugMessage << ", ";
    }
    if (messageType & VK_DEBUG_UTILS_MESSAGE_TYPE_VALIDATION_BIT_EXT)
    {
        debugMessage << "validation";
        if (messageType & VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT)
            debugMessage << ", ";
    }
    if (messageType & VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT)
        debugMessage << "performance";
    debugMessage << "): ";

    // callbackData->messageIdNumber is deprecated and starting with version 1.1.85 it is always 0
    debugMessage << (callbackData->pMessageIdName != nullptr ? callbackData->pMessageIdName : "<Unknown name>");
    if (callbackData->pMessage != nullptr)
    {
        debugMessage << std::endl
                     << "                 " << callbackData->pMessage;
    }

    if (callbackData->objectCount > 0)
    {
        for (uint32_t obj = 0; obj < callbackData->objectCount; ++obj)
        {
            const auto& Object = callbackData->pObjects[obj];
            debugMessage << std::endl
                         << "                 Object[" << obj << "] (" << VkObjectTypeToString(Object.objectType)
                         << "): Handle " << std::hex << "0x" << Object.objectHandle;
            if (Object.pObjectName != nullptr)
            {
                debugMessage << ", Name: '" << Object.pObjectName << '\'';
            }
        }
    }

    if (callbackData->cmdBufLabelCount > 0)
    {
        for (uint32_t l = 0; l < callbackData->cmdBufLabelCount; ++l)
        {
            const auto& Label = callbackData->pCmdBufLabels[l];
            debugMessage << std::endl
                         << "                 Label[" << l << "]";
            if (Label.pLabelName != nullptr)
            {
                debugMessage << " - " << Label.pLabelName;
            }
            debugMessage << " {";
            debugMessage << std::fixed << std::setw(4) << Label.color[0] << ", "
                         << std::fixed << std::setw(4) << Label.color[1] << ", "
                         << std::fixed << std::setw(4) << Label.color[2] << ", "
                         << std::fixed << std::setw(4) << Label.color[3] << "}";
        }
    }

    LOG_DEBUG_MESSAGE(MsgSeverity, debugMessage.str().c_str());

    // The return value of this callback controls whether the Vulkan call that caused
    // the validation message will be aborted or not
    // We return VK_FALSE as we DON'T want Vulkan calls that cause a validation message
    // (and return a VkResult) to abort
    return VK_FALSE;
}